

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_PrintDivOne(Vec_Int_t *vDiv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int local_14;
  int Lit;
  int i;
  Vec_Int_t *vDiv_local;
  
  for (local_14 = 0; iVar2 = Vec_IntSize(vDiv), local_14 < iVar2; local_14 = local_14 + 1) {
    iVar2 = Vec_IntEntry(vDiv,local_14);
    iVar3 = Abc_LitIsCompl(iVar2);
    if (iVar3 == 0) {
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_Var2Lit(local_14,iVar2);
      cVar1 = Fx_PrintDivLit(iVar2);
      printf("%c",(ulong)(uint)(int)cVar1);
    }
  }
  printf(" + ");
  for (local_14 = 0; iVar2 = Vec_IntSize(vDiv), local_14 < iVar2; local_14 = local_14 + 1) {
    iVar2 = Vec_IntEntry(vDiv,local_14);
    iVar3 = Abc_LitIsCompl(iVar2);
    if (iVar3 != 0) {
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_Var2Lit(local_14,iVar2);
      cVar1 = Fx_PrintDivLit(iVar2);
      printf("%c",(ulong)(uint)(int)cVar1);
    }
  }
  return;
}

Assistant:

static inline void Fx_PrintDivOne( Vec_Int_t * vDiv )
{
    int i, Lit;
    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( !Abc_LitIsCompl(Lit) )
            printf( "%c", Fx_PrintDivLit( Abc_Var2Lit(i, Abc_LitIsCompl(Lit)) ) );
    printf( " + " );
    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl(Lit) )
            printf( "%c", Fx_PrintDivLit( Abc_Var2Lit(i, Abc_LitIsCompl(Lit)) ) );
}